

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.c
# Opt level: O0

void quad_lookup_fill_distance(quad_lookup_t quads,distance_t *distances)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i_0;
  output_quad_t concat_out;
  uint i;
  distance_t *distances_local;
  
  for (i = 1; i < quads.outputs_len; i = i + 1) {
    bVar1 = (byte)quads.output_width;
    uVar2 = quads.outputs[i] >> (bVar1 & 0x1f);
    uVar3 = uVar2 >> (bVar1 & 0x1f);
    quads.distances[i] =
         (ulong)distances[uVar3 >> (bVar1 & 0x1f)] << 0x30 |
         (ulong)distances[uVar3 & quads.output_mask] << 0x20 |
         (long)(int)((uint)distances[uVar2 & quads.output_mask] << 0x10) |
         (ulong)distances[quads.outputs[i] & quads.output_mask];
  }
  return;
}

Assistant:

void quad_lookup_fill_distance(quad_lookup_t quads, distance_t *distances) {
    for (unsigned int i = 1; i < quads.outputs_len; i += 1) {
        output_quad_t concat_out = quads.outputs[i];
        unsigned int i_0 = concat_out & quads.output_mask;
        concat_out >>= quads.output_width;
        unsigned int i_1 = concat_out & quads.output_mask;
        concat_out >>= quads.output_width;
        unsigned int i_2 = concat_out & quads.output_mask;
        concat_out >>= quads.output_width;
        unsigned int i_3 = concat_out;

        quads.distances[i] = ((uint64_t)distances[i_3] << 48) | ((uint64_t)distances[i_2] << 32) | (distances[i_1] << 16) | distances[i_0];
    }
}